

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

PropertyIdOnRegSlotsContainer * Js::PropertyIdOnRegSlotsContainer::New(Recycler *recycler)

{
  Recycler *alloc;
  PropertyIdOnRegSlotsContainer *this;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x15f4;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_38);
  this = (PropertyIdOnRegSlotsContainer *)new<Memory::Recycler>(0x18,alloc,0x38bbb2);
  PropertyIdOnRegSlotsContainer(this);
  return this;
}

Assistant:

PropertyIdOnRegSlotsContainer * PropertyIdOnRegSlotsContainer::New(Recycler * recycler)
    {
        return RecyclerNew(recycler, PropertyIdOnRegSlotsContainer);
    }